

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O0

void __thiscall Farm::createBasket(Farm *this)

{
  bool bVar1;
  ostream *this_00;
  Basket basket;
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [12];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  anon_class_1_0_00000001 local_79;
  function<bool_(int)> local_78;
  allocator local_41;
  string local_40 [32];
  double local_20;
  double weight;
  Farm *pFStack_10;
  int nif;
  Farm *this_local;
  
  pFStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Enter client\'s nif: ",&local_41);
  std::function<bool(int)>::function<__0,void>((function<bool(int)> *)&local_78,&local_79);
  getOption((int *)((long)&weight + 4),(string *)local_40,&local_78);
  std::function<bool_(int)>::~function(&local_78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar1 = searchClientByNIF(this,weight._4_4_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Enter basket weight: ",&local_f1);
    getDouble(&local_20,(string *)local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    Basket::Basket((Basket *)local_108,local_20,weight._4_4_);
    basket._12_4_ = 0;
    basket.weight = (double)local_108._0_8_;
    basket.client_nif = local_108._8_4_;
    addBasket(this,basket);
    this->clientsFileChanged = true;
    this_00 = std::operator<<((ostream *)&std::cout,"Basket successfully created!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"ENTER to go back",&local_129);
    enterWait((string *)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!",
               &local_a1);
    cinERR((string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"ENTER to go back",&local_c9);
    enterWait((string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  return;
}

Assistant:

void Farm::createBasket() {
    int nif;
    double weight;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    getDouble(weight, "Enter basket weight: ");

    addBasket(Basket(weight, nif));

    clientsFileChanged = true;
    cout << "Basket successfully created!" << endl;
    enterWait();
}